

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_rb_generator.cc
# Opt level: O2

void __thiscall
t_rb_generator::generate_process_function
          (t_rb_generator *this,t_service *tservice,t_function *tfunction)

{
  string *psVar1;
  undefined1 *puVar2;
  t_struct *ptVar3;
  t_struct *ptVar4;
  bool bVar5;
  byte bVar6;
  int iVar7;
  t_rb_ofstream *ptVar8;
  ostream *poVar9;
  t_rb_ofstream *ptVar10;
  pointer pptVar11;
  char *pcVar12;
  string resultname;
  string argsname;
  string local_d0;
  string local_b0;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  ptVar10 = &this->f_service_;
  ptVar8 = t_rb_ofstream::indent(ptVar10);
  poVar9 = std::operator<<((ostream *)ptVar8,"def process_");
  psVar1 = &tfunction->name_;
  poVar9 = std::operator<<(poVar9,(string *)psVar1);
  poVar9 = std::operator<<(poVar9,"(seqid, iprot, oprot)");
  std::operator<<(poVar9,(string *)&::endl_abi_cxx11_);
  puVar2 = &(this->f_service_).super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
            field_0xf8;
  *(int *)puVar2 = *(int *)puVar2 + 1;
  std::__cxx11::string::string((string *)&local_50,(string *)psVar1);
  t_generator::capitalize(&local_d0,(t_generator *)this,&local_50);
  std::operator+(&local_70,&local_d0,"_args");
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::string((string *)&local_90,(string *)psVar1);
  t_generator::capitalize(&local_b0,(t_generator *)this,&local_90);
  std::operator+(&local_d0,&local_b0,"_result");
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_90);
  ptVar8 = t_rb_ofstream::indent(ptVar10);
  poVar9 = std::operator<<((ostream *)ptVar8,"args = read_args(iprot, ");
  poVar9 = std::operator<<(poVar9,(string *)&local_70);
  poVar9 = std::operator<<(poVar9,")");
  std::operator<<(poVar9,(string *)&::endl_abi_cxx11_);
  ptVar3 = tfunction->xceptions_;
  if (tfunction->oneway_ == false) {
    ptVar8 = t_rb_ofstream::indent(ptVar10);
    poVar9 = std::operator<<((ostream *)ptVar8,"result = ");
    poVar9 = std::operator<<(poVar9,(string *)&local_d0);
    poVar9 = std::operator<<(poVar9,".new()");
    std::operator<<(poVar9,(string *)&::endl_abi_cxx11_);
  }
  if ((ptVar3->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (ptVar3->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
      super__Vector_impl_data._M_start) {
    ptVar8 = t_rb_ofstream::indent(ptVar10);
    poVar9 = std::operator<<((ostream *)ptVar8,"begin");
    std::operator<<(poVar9,(string *)&::endl_abi_cxx11_);
    puVar2 = &(this->f_service_).super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
              field_0xf8;
    *(int *)puVar2 = *(int *)puVar2 + 1;
  }
  ptVar4 = tfunction->arglist_;
  t_rb_ofstream::indent(ptVar10);
  if (tfunction->oneway_ == false) {
    iVar7 = (*(tfunction->returntype_->super_t_doc)._vptr_t_doc[4])();
    if ((char)iVar7 == '\0') {
      std::operator<<((ostream *)ptVar10,"result.success = ");
    }
  }
  poVar9 = std::operator<<((ostream *)ptVar10,"@handler.");
  poVar9 = std::operator<<(poVar9,(string *)psVar1);
  std::operator<<(poVar9,"(");
  bVar5 = true;
  for (pptVar11 = (ptVar4->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
                  _M_impl.super__Vector_impl_data._M_start;
      pptVar11 !=
      (ptVar4->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
      super__Vector_impl_data._M_finish; pptVar11 = pptVar11 + 1) {
    if (!bVar5) {
      std::operator<<((ostream *)ptVar10,", ");
    }
    poVar9 = std::operator<<((ostream *)ptVar10,"args.");
    std::operator<<(poVar9,(string *)&(*pptVar11)->name_);
    bVar5 = false;
  }
  poVar9 = std::operator<<((ostream *)ptVar10,")");
  std::operator<<(poVar9,(string *)&::endl_abi_cxx11_);
  bVar6 = tfunction->oneway_;
  if (((bool)bVar6 == false) &&
     (pptVar11 = (ptVar3->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
                 _M_impl.super__Vector_impl_data._M_start,
     (ptVar3->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
     super__Vector_impl_data._M_finish != pptVar11)) {
    puVar2 = &(this->f_service_).super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
              field_0xf8;
    *(int *)puVar2 = *(int *)puVar2 + -1;
    for (; pptVar11 !=
           (ptVar3->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
           super__Vector_impl_data._M_finish; pptVar11 = pptVar11 + 1) {
      ptVar8 = t_rb_ofstream::indent(ptVar10);
      poVar9 = std::operator<<((ostream *)ptVar8,"rescue ");
      full_type_name_abi_cxx11_(&local_b0,this,(*pptVar11)->type_);
      poVar9 = std::operator<<(poVar9,(string *)&local_b0);
      poVar9 = std::operator<<(poVar9," => ");
      poVar9 = std::operator<<(poVar9,(string *)&(*pptVar11)->name_);
      std::operator<<(poVar9,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_b0);
      if (tfunction->oneway_ == false) {
        puVar2 = &(this->f_service_).super_ofstream.
                  super_basic_ostream<char,_std::char_traits<char>_>.field_0xf8;
        *(int *)puVar2 = *(int *)puVar2 + 1;
        ptVar8 = t_rb_ofstream::indent(ptVar10);
        poVar9 = std::operator<<((ostream *)ptVar8,"result.");
        poVar9 = std::operator<<(poVar9,(string *)&(*pptVar11)->name_);
        poVar9 = std::operator<<(poVar9," = ");
        poVar9 = std::operator<<(poVar9,(string *)&(*pptVar11)->name_);
        std::operator<<(poVar9,(string *)&::endl_abi_cxx11_);
        puVar2 = &(this->f_service_).super_ofstream.
                  super_basic_ostream<char,_std::char_traits<char>_>.field_0xf8;
        *(int *)puVar2 = *(int *)puVar2 + -1;
      }
    }
    ptVar8 = t_rb_ofstream::indent(ptVar10);
    poVar9 = std::operator<<((ostream *)ptVar8,"end");
    std::operator<<(poVar9,(string *)&::endl_abi_cxx11_);
    bVar6 = tfunction->oneway_;
  }
  if ((bVar6 & 1) == 0) {
    ptVar8 = t_rb_ofstream::indent(ptVar10);
    poVar9 = std::operator<<((ostream *)ptVar8,"write_result(result, oprot, \'");
    ptVar8 = (t_rb_ofstream *)std::operator<<(poVar9,(string *)psVar1);
    pcVar12 = "\', seqid)";
  }
  else {
    ptVar8 = t_rb_ofstream::indent(ptVar10);
    pcVar12 = "return";
  }
  poVar9 = std::operator<<((ostream *)ptVar8,pcVar12);
  std::operator<<(poVar9,(string *)&::endl_abi_cxx11_);
  puVar2 = &(this->f_service_).super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
            field_0xf8;
  *(int *)puVar2 = *(int *)puVar2 + -1;
  ptVar10 = t_rb_ofstream::indent(ptVar10);
  poVar9 = std::operator<<((ostream *)ptVar10,"end");
  poVar9 = std::operator<<(poVar9,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar9,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_70);
  return;
}

Assistant:

void t_rb_generator::generate_process_function(t_service* tservice, t_function* tfunction) {
  (void)tservice;
  // Open function
  f_service_.indent() << "def process_" << tfunction->get_name() << "(seqid, iprot, oprot)" << endl;
  f_service_.indent_up();

  string argsname = capitalize(tfunction->get_name()) + "_args";
  string resultname = capitalize(tfunction->get_name()) + "_result";

  f_service_.indent() << "args = read_args(iprot, " << argsname << ")" << endl;

  t_struct* xs = tfunction->get_xceptions();
  const std::vector<t_field*>& xceptions = xs->get_members();
  vector<t_field*>::const_iterator x_iter;

  // Declare result for non oneway function
  if (!tfunction->is_oneway()) {
    f_service_.indent() << "result = " << resultname << ".new()" << endl;
  }

  // Try block for a function with exceptions
  if (xceptions.size() > 0) {
    f_service_.indent() << "begin" << endl;
    f_service_.indent_up();
  }

  // Generate the function call
  t_struct* arg_struct = tfunction->get_arglist();
  const std::vector<t_field*>& fields = arg_struct->get_members();
  vector<t_field*>::const_iterator f_iter;

  f_service_.indent();
  if (!tfunction->is_oneway() && !tfunction->get_returntype()->is_void()) {
    f_service_ << "result.success = ";
  }
  f_service_ << "@handler." << tfunction->get_name() << "(";
  bool first = true;
  for (f_iter = fields.begin(); f_iter != fields.end(); ++f_iter) {
    if (first) {
      first = false;
    } else {
      f_service_ << ", ";
    }
    f_service_ << "args." << (*f_iter)->get_name();
  }
  f_service_ << ")" << endl;

  if (!tfunction->is_oneway() && xceptions.size() > 0) {
    f_service_.indent_down();
    for (x_iter = xceptions.begin(); x_iter != xceptions.end(); ++x_iter) {
      f_service_.indent() << "rescue " << full_type_name((*x_iter)->get_type()) << " => "
                          << (*x_iter)->get_name() << endl;
      if (!tfunction->is_oneway()) {
        f_service_.indent_up();
        f_service_.indent() << "result." << (*x_iter)->get_name() << " = " << (*x_iter)->get_name()
                            << endl;
        f_service_.indent_down();
      }
    }
    f_service_.indent() << "end" << endl;
  }

  // Shortcut out here for oneway functions
  if (tfunction->is_oneway()) {
    f_service_.indent() << "return" << endl;
    f_service_.indent_down();
    f_service_.indent() << "end" << endl << endl;
    return;
  }

  f_service_.indent() << "write_result(result, oprot, '" << tfunction->get_name() << "', seqid)"
                      << endl;

  // Close function
  f_service_.indent_down();
  f_service_.indent() << "end" << endl << endl;
}